

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_summon.cpp
# Opt level: O2

int AF_A_Summon(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  byte *pbVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  AActor *mobj;
  AActor *pAVar4;
  AInventory *this_00;
  AArtiDarkServant *pAVar5;
  AActor *ent;
  char *__assertion;
  BYTE BVar6;
  FSoundID local_50;
  FName local_4c;
  DVector3 local_48;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005443b4;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005443a4;
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_005441a7;
    bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005443b4;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_005443a4;
LAB_005441a7:
    ent = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_00544227;
  VVar2 = param[1].field_0.field_3.Type;
  if (VVar2 != 0xff) {
    if (VVar2 != '\x03') {
LAB_005443a4:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005443b4;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005443b4;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_005443a4;
  }
  if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
     ((VVar2 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00544227:
    local_48.X = (ent->__Pos).X;
    local_48.Y = (ent->__Pos).Y;
    local_48.Z = (ent->__Pos).Z;
    mobj = (AActor *)Spawn<AMinotaurFriend>(&local_48,ALLOW_REPLACE);
    if (mobj != (AActor *)0x0) {
      bVar3 = P_TestMobjLocation(mobj);
      if (bVar3) {
        obj = &ent->tracer;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar4 != (AActor *)0x0) {
          *(int *)&mobj->field_0x49c = level.maptime;
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
          if (((pAVar4->flags).Value & 0x100000) == 0) {
            (mobj->tracer).field_0 = obj->field_0;
            this_00 = (AInventory *)Spawn<APowerMinotaur>();
            pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
            BVar6 = '\0';
            AInventory::CallTryPickup(this_00,pAVar4,(AActor **)0x0);
            pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
            if (pAVar4->player != (player_t *)0x0) {
              BVar6 = (char)((long)(pAVar4->player[-0x3b4b].frags + 7) / 0x2a0) + '\x01';
            }
            mobj->FriendPlayer = BVar6;
          }
          else {
            (mobj->tracer).field_0.p = (AActor *)0x0;
          }
          FName::FName(&local_4c,"MinotaurSmoke");
          local_48.X = (ent->__Pos).X;
          local_48.Y = (ent->__Pos).Y;
          local_48.Z = (ent->__Pos).Z;
          Spawn(&local_4c,&local_48,ALLOW_REPLACE);
          local_50.ID = (mobj->ActiveSound).super_FSoundID.ID;
          S_Sound(ent,2,&local_50,1.0,1.0);
          return 0;
        }
      }
      (*(mobj->super_DThinker).super_DObject._vptr_DObject[4])(mobj);
      local_48.X = (ent->__Pos).X;
      local_48.Y = (ent->__Pos).Y;
      local_48.Z = (ent->__Pos).Z;
      pAVar5 = Spawn<AArtiDarkServant>(&local_48,ALLOW_REPLACE);
      if (pAVar5 != (AArtiDarkServant *)0x0) {
        pbVar1 = (byte *)((long)&(pAVar5->super_AInventory).super_AActor.flags.Value + 2);
        *pbVar1 = *pbVar1 | 2;
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005443b4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Summon)
{
	PARAM_ACTION_PROLOGUE;

	AMinotaurFriend *mo;

	mo = Spawn<AMinotaurFriend>(self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		if (P_TestMobjLocation(mo) == false || !self->tracer)
		{ // Didn't fit - change back to artifact
			mo->Destroy();
			AActor *arti = Spawn<AArtiDarkServant>(self->Pos(), ALLOW_REPLACE);
			if (arti) arti->flags |= MF_DROPPED;
			return 0;
		}

		mo->StartTime = level.maptime;
		if (self->tracer->flags & MF_CORPSE)
		{	// Master dead
			mo->tracer = NULL;		// No master
		}
		else
		{
			mo->tracer = self->tracer;		// Pointer to master
			AInventory *power = Spawn<APowerMinotaur>();
			power->CallTryPickup(self->tracer);
			mo->SetFriendPlayer(self->tracer->player);
		}

		// Make smoke puff
		Spawn("MinotaurSmoke", self->Pos(), ALLOW_REPLACE);
		S_Sound(self, CHAN_VOICE, mo->ActiveSound, 1, ATTN_NORM);
	}
	return 0;
}